

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::propagatePseudoobj
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp)

{
  Tolerances *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar3;
  Real RVar4;
  bool bVar5;
  int iVar6;
  pointer pnVar7;
  TightenBoundsPS *pTVar9;
  cpp_dec_float<50U,_int,_void> *v;
  uint *puVar10;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  objval;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_528;
  cpp_dec_float<50U,_int,_void> *local_4e8;
  undefined8 uStack_4e0;
  cpp_dec_float<50U,_int,_void> local_4d8;
  cpp_dec_float<50U,_int,_void> *local_4a0;
  cpp_dec_float<50U,_int,_void> local_498;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_460;
  undefined1 local_458 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_450;
  uint local_448 [3];
  undefined3 uStack_43b;
  uint uStack_438;
  undefined8 uStack_433;
  undefined8 local_428;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_418;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_410;
  shared_ptr<soplex::Tolerances> local_408;
  shared_ptr<soplex::Tolerances> local_3f8;
  cpp_dec_float<50U,_int,_void> local_3e8;
  long local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  
  local_3e8.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_3e8.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_3e8.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_3e8.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_3e8.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_3e8.exp =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.exp;
  local_3e8.neg =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.neg;
  local_3e8.fpclass =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.fpclass;
  local_3e8.prec_elem =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.prec_elem;
  lVar11 = (long)(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (0 < lVar11) {
    local_4e8 = (cpp_dec_float<50U,_int,_void> *)
                ((ulong)*(double *)(in_FS_OFFSET + -8) ^ 0x8000000000000000);
    uStack_4e0 = 0x8000000000000000;
    uVar12 = lVar11 + 1;
    lVar11 = lVar11 * 0x38;
    do {
      pnVar7 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_4d8.data._M_elems._32_8_ =
           *(undefined8 *)((long)pnVar7[-1].m_backend.data._M_elems + lVar11 + 0x20);
      puVar10 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar11);
      local_4d8.data._M_elems._0_8_ = *(undefined8 *)puVar10;
      local_4d8.data._M_elems._8_8_ = *(undefined8 *)(puVar10 + 2);
      puVar10 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar11 + 0x10);
      local_4d8.data._M_elems._16_8_ = *(undefined8 *)puVar10;
      local_4d8.data._M_elems._24_8_ = *(undefined8 *)(puVar10 + 2);
      local_4d8.exp = *(int *)((long)(&pnVar7[-1].m_backend.data + 1) + lVar11);
      local_4d8.neg = *(bool *)((long)(&pnVar7[-1].m_backend.data + 1) + lVar11 + 4U);
      local_4d8._48_8_ = *(undefined8 *)((long)(&pnVar7[-1].m_backend.data + 1) + lVar11 + 8U);
      if (local_4d8.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_528,0,(type *)0x0);
        iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_4d8,&local_528);
        if (iVar6 < 0) {
          pnVar7 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_528.fpclass = cpp_dec_float_finite;
          local_528.prec_elem = 10;
          local_528.data._M_elems[0] = 0;
          local_528.data._M_elems[1] = 0;
          local_528.data._M_elems[2] = 0;
          local_528.data._M_elems[3] = 0;
          local_528.data._M_elems[4] = 0;
          local_528.data._M_elems[5] = 0;
          local_528.data._M_elems._24_5_ = 0;
          local_528.data._M_elems[7]._1_3_ = 0;
          local_528.data._M_elems._32_5_ = 0;
          local_528.data._M_elems[9]._1_3_ = 0;
          local_528.exp = 0;
          local_528.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_528,(double)local_4e8);
          if (((*(int *)((long)(&pnVar7[-1].m_backend.data + 1) + lVar11 + 8U) != 2) &&
              (local_528.fpclass != cpp_dec_float_NaN)) &&
             (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)pnVar7[-1].m_backend.data._M_elems + lVar11),&local_528),
             iVar6 < 1)) {
            return;
          }
          pnVar7 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
LAB_002ee314:
          pcVar8 = (cpp_dec_float<50U,_int,_void> *)
                   ((long)pnVar7[-1].m_backend.data._M_elems + lVar11);
          local_528.fpclass = cpp_dec_float_finite;
          local_528.prec_elem = 10;
          local_528.data._M_elems[0] = 0;
          local_528.data._M_elems[1] = 0;
          local_528.data._M_elems[2] = 0;
          local_528.data._M_elems[3] = 0;
          local_528.data._M_elems[4] = 0;
          local_528.data._M_elems[5] = 0;
          local_528.data._M_elems._24_5_ = 0;
          local_528.data._M_elems[7]._1_3_ = 0;
          local_528.data._M_elems._32_5_ = 0;
          local_528.data._M_elems[9]._1_3_ = 0;
          local_528.exp = 0;
          local_528.neg = false;
          v = &local_4d8;
          if (pcVar8 != &local_528) {
            local_528.data._M_elems._32_5_ = local_4d8.data._M_elems._32_5_;
            local_528.data._M_elems[9]._1_3_ = local_4d8.data._M_elems[9]._1_3_;
            local_528.data._M_elems[4] = local_4d8.data._M_elems[4];
            local_528.data._M_elems[5] = local_4d8.data._M_elems[5];
            local_528.data._M_elems._24_5_ = local_4d8.data._M_elems._24_5_;
            local_528.data._M_elems[7]._1_3_ = local_4d8.data._M_elems[7]._1_3_;
            local_528.data._M_elems[0] = local_4d8.data._M_elems[0];
            local_528.data._M_elems[1] = local_4d8.data._M_elems[1];
            local_528.data._M_elems[2] = local_4d8.data._M_elems[2];
            local_528.data._M_elems[3] = local_4d8.data._M_elems[3];
            local_528.exp = local_4d8.exp;
            local_528.neg = local_4d8.neg;
            local_528.fpclass = local_4d8.fpclass;
            local_528.prec_elem = local_4d8.prec_elem;
            v = pcVar8;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_528,v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_3e8,&local_528);
        }
        else if (local_4d8.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_528,0,(type *)0x0);
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_4d8,&local_528);
          if (0 < iVar6) {
            pnVar7 = (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_528.fpclass = cpp_dec_float_finite;
            local_528.prec_elem = 10;
            local_528.data._M_elems[0] = 0;
            local_528.data._M_elems[1] = 0;
            local_528.data._M_elems[2] = 0;
            local_528.data._M_elems[3] = 0;
            local_528.data._M_elems[4] = 0;
            local_528.data._M_elems[5] = 0;
            local_528.data._M_elems._24_5_ = 0;
            local_528.data._M_elems[7]._1_3_ = 0;
            local_528.data._M_elems._32_5_ = 0;
            local_528.data._M_elems[9]._1_3_ = 0;
            local_528.exp = 0;
            local_528.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_528,(double)local_4e8);
            if (((*(int *)((long)(&pnVar7[-1].m_backend.data + 1) + lVar11 + 8U) != 2) &&
                (local_528.fpclass != cpp_dec_float_NaN)) &&
               (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)
                                   ((long)pnVar7[-1].m_backend.data._M_elems + lVar11),&local_528),
               -1 < iVar6)) {
              return;
            }
            pnVar7 = (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_002ee314;
          }
        }
      }
      uVar12 = uVar12 - 1;
      lVar11 = lVar11 + -0x38;
    } while (1 < uVar12);
  }
  local_128.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8);
  local_128.m_backend.data._M_elems._0_8_ =
       *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6);
  local_128.m_backend.exp = (this->m_cutoffbound).m_backend.exp;
  local_128.m_backend.neg = (this->m_cutoffbound).m_backend.neg;
  local_128.m_backend.fpclass = (this->m_cutoffbound).m_backend.fpclass;
  local_128.m_backend.prec_elem = (this->m_cutoffbound).m_backend.prec_elem;
  ::soplex::infinity::__tls_init();
  local_4e8 = *(cpp_dec_float<50U,_int,_void> **)(in_FS_OFFSET + -8);
  uStack_4e0 = 0;
  local_68.m_backend.fpclass = cpp_dec_float_finite;
  local_68.m_backend.prec_elem = 10;
  local_68.m_backend.data._M_elems[0] = 0;
  local_68.m_backend.data._M_elems[1] = 0;
  local_68.m_backend.data._M_elems[2] = 0;
  local_68.m_backend.data._M_elems[3] = 0;
  local_68.m_backend.data._M_elems[4] = 0;
  local_68.m_backend.data._M_elems[5] = 0;
  local_68.m_backend.data._M_elems._24_5_ = 0;
  local_68.m_backend.data._M_elems[7]._1_3_ = 0;
  local_68.m_backend.data._M_elems._32_5_ = 0;
  local_68.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,-(double)local_4e8);
  pTVar1 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RVar4 = Tolerances::epsilon(pTVar1);
  bVar5 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&local_128,&local_68,RVar4);
  local_4a0 = &(this->m_cutoffbound).m_backend;
  if (bVar5) {
    local_168.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8);
    local_168.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)
          (((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_4a0)->m_backend).data._M_elems;
    local_168.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2);
    local_168.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4);
    local_168.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6);
    local_168.m_backend.exp = (this->m_cutoffbound).m_backend.exp;
    local_168.m_backend.neg = (this->m_cutoffbound).m_backend.neg;
    local_168.m_backend.fpclass = (this->m_cutoffbound).m_backend.fpclass;
    local_168.m_backend.prec_elem = (this->m_cutoffbound).m_backend.prec_elem;
    ::soplex::infinity::__tls_init();
    local_a8.m_backend.fpclass = cpp_dec_float_finite;
    local_a8.m_backend.prec_elem = 10;
    local_a8.m_backend.data._M_elems[0] = 0;
    local_a8.m_backend.data._M_elems[1] = 0;
    local_a8.m_backend.data._M_elems[2] = 0;
    local_a8.m_backend.data._M_elems[3] = 0;
    local_a8.m_backend.data._M_elems[4] = 0;
    local_a8.m_backend.data._M_elems[5] = 0;
    local_a8.m_backend.data._M_elems._24_5_ = 0;
    local_a8.m_backend.data._M_elems[7]._1_3_ = 0;
    local_a8.m_backend.data._M_elems._32_5_ = 0;
    local_a8.m_backend._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_a8,(double)local_4e8);
    pTVar1 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    this_00 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    RVar4 = Tolerances::epsilon(pTVar1);
    bVar5 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_168,&local_a8,RVar4);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    bVar5 = false;
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (bVar5 != false) {
    local_4e8 = &(this->m_pseudoobj).m_backend;
    if (((local_3e8.fpclass != cpp_dec_float_NaN) &&
        ((this->m_pseudoobj).m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_3e8,local_4e8), 0 < iVar6)) {
      *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_4e8->data)->data)._M_elems + 8) =
           local_3e8.data._M_elems._32_8_;
      *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_4e8->data)->data)._M_elems + 4) =
           local_3e8.data._M_elems._16_8_;
      *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_4e8->data)->data)._M_elems + 6) =
           local_3e8.data._M_elems._24_8_;
      *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_4e8->data)->data)._M_elems =
           local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_4e8->data)->data)._M_elems + 2) =
           local_3e8.data._M_elems._8_8_;
      (this->m_pseudoobj).m_backend.exp = local_3e8.exp;
      (this->m_pseudoobj).m_backend.neg = local_3e8.neg;
      (this->m_pseudoobj).m_backend.fpclass = local_3e8.fpclass;
      (this->m_pseudoobj).m_backend.prec_elem = local_3e8.prec_elem;
    }
    uVar12 = (ulong)(lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
    if (0 < (long)uVar12) {
      local_418 = &this->m_hist;
      lVar11 = uVar12 * 0x38;
      local_460 = this;
      local_410 = lp;
      do {
        pnVar7 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_4d8.data._M_elems._32_8_ =
             *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x18);
        puVar10 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar11);
        local_4d8.data._M_elems._0_8_ = *(undefined8 *)puVar10;
        local_4d8.data._M_elems._8_8_ = *(undefined8 *)(puVar10 + 2);
        puVar10 = (uint *)((long)(&(pnVar7->m_backend).data + -1) + lVar11);
        local_4d8.data._M_elems._16_8_ = *(undefined8 *)puVar10;
        local_4d8.data._M_elems._24_8_ = *(undefined8 *)(puVar10 + 2);
        local_4d8.exp = *(int *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x10);
        local_4d8.neg = *(bool *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0xc);
        local_3a8.m_backend.fpclass =
             *(fpclass_type *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -8);
        local_3a8.m_backend.prec_elem =
             *(int32_t *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -4);
        local_4d8.prec_elem = local_3a8.m_backend.prec_elem;
        local_4d8.fpclass = local_3a8.m_backend.fpclass;
        local_e8.m_backend.fpclass = cpp_dec_float_finite;
        local_e8.m_backend.prec_elem = 10;
        local_e8.m_backend.data._M_elems[0] = 0;
        local_e8.m_backend.data._M_elems[1] = 0;
        local_e8.m_backend.data._M_elems[2] = 0;
        local_e8.m_backend.data._M_elems[3] = 0;
        local_e8.m_backend.data._M_elems[4] = 0;
        local_e8.m_backend.data._M_elems[5] = 0;
        local_e8.m_backend.data._M_elems._24_5_ = 0;
        local_e8.m_backend.data._M_elems[7]._1_3_ = 0;
        local_e8.m_backend.data._M_elems._32_5_ = 0;
        local_e8.m_backend._37_8_ = 0;
        local_3a8.m_backend.data._M_elems._0_8_ = local_4d8.data._M_elems._0_8_;
        local_3a8.m_backend.data._M_elems._8_8_ = local_4d8.data._M_elems._8_8_;
        local_3a8.m_backend.data._M_elems._16_8_ = local_4d8.data._M_elems._16_8_;
        local_3a8.m_backend.data._M_elems._24_8_ = local_4d8.data._M_elems._24_8_;
        local_3a8.m_backend.data._M_elems._32_8_ = local_4d8.data._M_elems._32_8_;
        local_3a8.m_backend.exp = local_4d8.exp;
        local_3a8.m_backend.neg = local_4d8.neg;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_e8,0.0);
        pTVar1 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var2 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        RVar4 = Tolerances::epsilon(pTVar1);
        bVar5 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_3a8,&local_e8,RVar4);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        if (!bVar5 && local_4d8.fpclass != cpp_dec_float_NaN) {
          local_528.fpclass = cpp_dec_float_finite;
          local_528.prec_elem = 10;
          local_528.data._M_elems[0] = 0;
          local_528.data._M_elems[1] = 0;
          local_528.data._M_elems[2] = 0;
          local_528.data._M_elems[3] = 0;
          local_528.data._M_elems[4] = 0;
          local_528.data._M_elems[5] = 0;
          local_528.data._M_elems._24_5_ = 0;
          local_528.data._M_elems[7]._1_3_ = 0;
          local_528.data._M_elems._32_5_ = 0;
          local_528.data._M_elems[9]._1_3_ = 0;
          local_528.exp = 0;
          local_528.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_528,0.0);
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_4d8,&local_528);
          if (iVar6 < 0) {
            pnVar7 = (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_498.fpclass = cpp_dec_float_finite;
            local_498.prec_elem = 10;
            local_498.data._M_elems[0] = 0;
            local_498.data._M_elems[1] = 0;
            local_498.data._M_elems[2] = 0;
            local_498.data._M_elems[3] = 0;
            local_498.data._M_elems[4] = 0;
            local_498.data._M_elems[5] = 0;
            local_498.data._M_elems._24_5_ = 0;
            local_498.data._M_elems[7]._1_3_ = 0;
            local_498.data._M_elems._32_5_ = 0;
            local_498.data._M_elems[9]._1_3_ = 0;
            local_498.exp = 0;
            local_498.neg = false;
            if (&local_498 == local_4e8) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_498,local_4a0);
              if (local_498.data._M_elems[0] != 0 || local_498.fpclass != cpp_dec_float_finite) {
                local_498.neg = (bool)(local_498.neg ^ 1);
              }
            }
            else {
              if (&local_498 != local_4a0) {
                uVar3 = *(undefined8 *)((local_4a0->data)._M_elems + 8);
                local_498.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_498.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_498.data._M_elems._0_8_ = *(undefined8 *)(local_4a0->data)._M_elems;
                local_498.data._M_elems._8_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 2);
                local_498.data._M_elems._16_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((local_4a0->data)._M_elems + 6);
                local_498.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_498.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_498.exp = (this->m_cutoffbound).m_backend.exp;
                local_498.neg = (this->m_cutoffbound).m_backend.neg;
                local_498.fpclass = (this->m_cutoffbound).m_backend.fpclass;
                local_498.prec_elem = (this->m_cutoffbound).m_backend.prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_498,local_4e8);
            }
            puVar10 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar11);
            local_428._0_4_ = cpp_dec_float_finite;
            local_428._4_4_ = 10;
            local_458 = (undefined1  [8])0x0;
            _Stack_450._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_448[0] = 0;
            local_448[1] = 0;
            stack0xfffffffffffffbc0 = 0;
            uStack_43b = 0;
            _uStack_438 = 0;
            uStack_433 = 0;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)local_458,&local_498,&local_4d8);
            local_528.fpclass = cpp_dec_float_finite;
            local_528.prec_elem = 10;
            local_528.data._M_elems[0] = 0;
            local_528.data._M_elems[1] = 0;
            local_528.data._M_elems[2] = 0;
            local_528.data._M_elems[3] = 0;
            local_528.data._M_elems[4] = 0;
            local_528.data._M_elems[5] = 0;
            local_528.data._M_elems._24_5_ = 0;
            local_528.data._M_elems[7]._1_3_ = 0;
            local_528.data._M_elems._32_5_ = 0;
            local_528.data._M_elems[9]._1_3_ = 0;
            local_528.exp = 0;
            local_528.neg = false;
            if ((cpp_dec_float<50U,_int,_void> *)puVar10 != &local_528) {
              uVar3 = *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x18);
              local_528.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_528.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_528.data._M_elems._0_8_ = *(undefined8 *)puVar10;
              local_528.data._M_elems._8_8_ =
                   *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x30);
              local_528.data._M_elems._16_8_ =
                   *(undefined8 *)((long)(&(pnVar7->m_backend).data + -1) + lVar11);
              uVar3 = *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x20);
              local_528.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_528.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_528.exp = *(int *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x10);
              local_528.neg = *(bool *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0xc);
              local_528._48_8_ =
                   *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -8);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_528,(cpp_dec_float<50U,_int,_void> *)local_458);
            lp = local_410;
            this = local_460;
            local_1a8.m_backend.data._M_elems[7]._1_3_ = local_528.data._M_elems[7]._1_3_;
            local_1a8.m_backend.data._M_elems._24_5_ = local_528.data._M_elems._24_5_;
            local_1a8.m_backend.data._M_elems[0] = local_528.data._M_elems[0];
            local_1a8.m_backend.data._M_elems[1] = local_528.data._M_elems[1];
            local_1a8.m_backend.data._M_elems[2] = local_528.data._M_elems[2];
            local_1a8.m_backend.data._M_elems[3] = local_528.data._M_elems[3];
            local_1a8.m_backend.data._M_elems[4] = local_528.data._M_elems[4];
            local_1a8.m_backend.data._M_elems[5] = local_528.data._M_elems[5];
            local_1a8.m_backend.data._M_elems[9]._1_3_ = local_528.data._M_elems[9]._1_3_;
            local_1a8.m_backend.data._M_elems._32_5_ = local_528.data._M_elems._32_5_;
            local_1a8.m_backend.exp = local_528.exp;
            local_1a8.m_backend.neg = local_528.neg;
            local_1a8.m_backend.fpclass = local_528.fpclass;
            local_1a8.m_backend.prec_elem = local_528.prec_elem;
            pnVar7 = (local_410->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar10 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar11);
            local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar10;
            local_1e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar10 + 2);
            puVar10 = (uint *)((long)(&(pnVar7->m_backend).data + -1) + lVar11);
            local_1e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar10;
            local_1e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar10 + 2);
            local_1e8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x18);
            local_1e8.m_backend.exp =
                 *(int *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x10);
            local_1e8.m_backend.neg =
                 *(bool *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0xc);
            local_1e8.m_backend._48_8_ =
                 *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -8);
            pTVar1 = (local_460->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var2 = (local_460->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              }
            }
            RVar4 = Tolerances::epsilon(pTVar1);
            bVar5 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                              (&local_1a8,&local_1e8,RVar4);
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
            if (bVar5) {
              pTVar9 = (TightenBoundsPS *)operator_new(0xa0);
              pnVar7 = (lp->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar10 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar11);
              local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar10;
              local_228.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar10 + 2);
              puVar10 = (uint *)((long)(&(pnVar7->m_backend).data + -1) + lVar11);
              local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar10;
              local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar10 + 2);
              local_228.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x18);
              local_228.m_backend.exp =
                   *(int *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x10);
              local_228.m_backend.neg =
                   *(bool *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0xc);
              local_228.m_backend._48_8_ =
                   *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -8);
              pnVar7 = (lp->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar10 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar11);
              local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar10;
              local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar10 + 2);
              puVar10 = (uint *)((long)(&(pnVar7->m_backend).data + -1) + lVar11);
              local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar10;
              local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar10 + 2);
              local_268.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x18);
              local_268.m_backend.exp =
                   *(int *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x10);
              local_268.m_backend.neg =
                   *(bool *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0xc);
              local_268.m_backend._48_8_ =
                   *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -8);
              local_3f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_3f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (local_3f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_3f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_3f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_3f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_3f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              TightenBoundsPS::TightenBoundsPS
                        (pTVar9,lp,(int)(uVar12 - 1),&local_228,&local_268,&local_3f8);
              local_458 = (undefined1  [8])pTVar9;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::TightenBoundsPS*>
                        (&_Stack_450,pTVar9);
              if (local_3f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_3f8.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&local_418->data,(value_type *)local_458);
              this = local_460;
              (*(lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x2d])(lp,uVar12 - 1 & 0xffffffff,&local_528,0);
LAB_002ef06c:
              if (_Stack_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_450._M_pi);
              }
            }
          }
          else if (local_4d8.fpclass != cpp_dec_float_NaN) {
            local_528.fpclass = cpp_dec_float_finite;
            local_528.prec_elem = 10;
            local_528.data._M_elems[0] = 0;
            local_528.data._M_elems[1] = 0;
            local_528.data._M_elems[2] = 0;
            local_528.data._M_elems[3] = 0;
            local_528.data._M_elems[4] = 0;
            local_528.data._M_elems[5] = 0;
            local_528.data._M_elems._24_5_ = 0;
            local_528.data._M_elems[7]._1_3_ = 0;
            local_528.data._M_elems._32_5_ = 0;
            local_528.data._M_elems[9]._1_3_ = 0;
            local_528.exp = 0;
            local_528.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_528,0.0);
            iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_4d8,&local_528);
            if (0 < iVar6) {
              pnVar7 = (lp->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_498.fpclass = cpp_dec_float_finite;
              local_498.prec_elem = 10;
              local_498.data._M_elems[0] = 0;
              local_498.data._M_elems[1] = 0;
              local_498.data._M_elems[2] = 0;
              local_498.data._M_elems[3] = 0;
              local_498.data._M_elems[4] = 0;
              local_498.data._M_elems[5] = 0;
              local_498.data._M_elems._24_5_ = 0;
              local_498.data._M_elems[7]._1_3_ = 0;
              local_498.data._M_elems._32_5_ = 0;
              local_498.data._M_elems[9]._1_3_ = 0;
              local_498.exp = 0;
              local_498.neg = false;
              if (&local_498 == local_4e8) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_498,local_4a0);
                if (local_498.data._M_elems[0] != 0 || local_498.fpclass != cpp_dec_float_finite) {
                  local_498.neg = (bool)(local_498.neg ^ 1);
                }
              }
              else {
                if (&local_498 != local_4a0) {
                  uVar3 = *(undefined8 *)((local_4a0->data)._M_elems + 8);
                  local_498.data._M_elems._32_5_ = SUB85(uVar3,0);
                  local_498.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_498.data._M_elems._0_8_ = *(undefined8 *)(local_4a0->data)._M_elems;
                  local_498.data._M_elems._8_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 2);
                  local_498.data._M_elems._16_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 4);
                  uVar3 = *(undefined8 *)((local_4a0->data)._M_elems + 6);
                  local_498.data._M_elems._24_5_ = SUB85(uVar3,0);
                  local_498.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_498.exp = (this->m_cutoffbound).m_backend.exp;
                  local_498.neg = (this->m_cutoffbound).m_backend.neg;
                  local_498.fpclass = (this->m_cutoffbound).m_backend.fpclass;
                  local_498.prec_elem = (this->m_cutoffbound).m_backend.prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_498,local_4e8);
              }
              puVar10 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar11);
              local_428._0_4_ = cpp_dec_float_finite;
              local_428._4_4_ = 10;
              local_458 = (undefined1  [8])0x0;
              _Stack_450._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_448[0] = 0;
              local_448[1] = 0;
              stack0xfffffffffffffbc0 = 0;
              uStack_43b = 0;
              _uStack_438 = 0;
              uStack_433 = 0;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        ((cpp_dec_float<50U,_int,_void> *)local_458,&local_498,&local_4d8);
              local_528.fpclass = cpp_dec_float_finite;
              local_528.prec_elem = 10;
              local_528.data._M_elems[0] = 0;
              local_528.data._M_elems[1] = 0;
              local_528.data._M_elems[2] = 0;
              local_528.data._M_elems[3] = 0;
              local_528.data._M_elems[4] = 0;
              local_528.data._M_elems[5] = 0;
              local_528.data._M_elems._24_5_ = 0;
              local_528.data._M_elems[7]._1_3_ = 0;
              local_528.data._M_elems._32_5_ = 0;
              local_528.data._M_elems[9]._1_3_ = 0;
              local_528.exp = 0;
              local_528.neg = false;
              if ((cpp_dec_float<50U,_int,_void> *)puVar10 != &local_528) {
                uVar3 = *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x18);
                local_528.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_528.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_528.data._M_elems._0_8_ = *(undefined8 *)puVar10;
                local_528.data._M_elems._8_8_ =
                     *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x30);
                local_528.data._M_elems._16_8_ =
                     *(undefined8 *)((long)(&(pnVar7->m_backend).data + -1) + lVar11);
                uVar3 = *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x20);
                local_528.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_528.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_528.exp = *(int *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x10);
                local_528.neg = *(bool *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0xc);
                local_528._48_8_ =
                     *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -8);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_528,(cpp_dec_float<50U,_int,_void> *)local_458);
              lp = local_410;
              this = local_460;
              local_2a8.m_backend.data._M_elems[7]._1_3_ = local_528.data._M_elems[7]._1_3_;
              local_2a8.m_backend.data._M_elems._24_5_ = local_528.data._M_elems._24_5_;
              local_2a8.m_backend.data._M_elems[0] = local_528.data._M_elems[0];
              local_2a8.m_backend.data._M_elems[1] = local_528.data._M_elems[1];
              local_2a8.m_backend.data._M_elems[2] = local_528.data._M_elems[2];
              local_2a8.m_backend.data._M_elems[3] = local_528.data._M_elems[3];
              local_2a8.m_backend.data._M_elems[4] = local_528.data._M_elems[4];
              local_2a8.m_backend.data._M_elems[5] = local_528.data._M_elems[5];
              local_2a8.m_backend.data._M_elems[9]._1_3_ = local_528.data._M_elems[9]._1_3_;
              local_2a8.m_backend.data._M_elems._32_5_ = local_528.data._M_elems._32_5_;
              local_2a8.m_backend.exp = local_528.exp;
              local_2a8.m_backend.neg = local_528.neg;
              local_2a8.m_backend.fpclass = local_528.fpclass;
              local_2a8.m_backend.prec_elem = local_528.prec_elem;
              pnVar7 = (local_410->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar10 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar11);
              local_2e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar10;
              local_2e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar10 + 2);
              puVar10 = (uint *)((long)(&(pnVar7->m_backend).data + -1) + lVar11);
              local_2e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar10;
              local_2e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar10 + 2);
              local_2e8.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x18);
              local_2e8.m_backend.exp =
                   *(int *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x10);
              local_2e8.m_backend.neg =
                   *(bool *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0xc);
              local_2e8.m_backend._48_8_ =
                   *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -8);
              pTVar1 = (local_460->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var2 = (local_460->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                }
              }
              RVar4 = Tolerances::epsilon(pTVar1);
              bVar5 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                (&local_2a8,&local_2e8,RVar4);
              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
              }
              if (bVar5) {
                pTVar9 = (TightenBoundsPS *)operator_new(0xa0);
                pnVar7 = (lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).up.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar10 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar11);
                local_328.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar10;
                local_328.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar10 + 2);
                puVar10 = (uint *)((long)(&(pnVar7->m_backend).data + -1) + lVar11);
                local_328.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar10;
                local_328.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar10 + 2);
                local_328.m_backend.data._M_elems._32_8_ =
                     *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x18);
                local_328.m_backend.exp =
                     *(int *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x10);
                local_328.m_backend.neg =
                     *(bool *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0xc);
                local_328.m_backend._48_8_ =
                     *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -8);
                pnVar7 = (lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar10 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar11);
                local_368.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar10;
                local_368.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar10 + 2);
                puVar10 = (uint *)((long)(&(pnVar7->m_backend).data + -1) + lVar11);
                local_368.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar10;
                local_368.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar10 + 2);
                local_368.m_backend.data._M_elems._32_8_ =
                     *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x18);
                local_368.m_backend.exp =
                     *(int *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0x10);
                local_368.m_backend.neg =
                     *(bool *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -0xc);
                local_368.m_backend._48_8_ =
                     *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar11 + -8);
                local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
                if (local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_408.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_408.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                local_3b0 = uVar12 - 1;
                TightenBoundsPS::TightenBoundsPS
                          (pTVar9,lp,(int)local_3b0,&local_328,&local_368,&local_408);
                local_458 = (undefined1  [8])pTVar9;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::TightenBoundsPS*>
                          (&_Stack_450,pTVar9);
                if (local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_408.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                std::
                vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                ::push_back(&local_418->data,(value_type *)local_458);
                (*(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x2a])(lp,local_3b0,&local_528,0);
                goto LAB_002ef06c;
              }
            }
          }
        }
        lVar11 = lVar11 + -0x38;
        bVar5 = 1 < uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar5);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::propagatePseudoobj(SPxLPBase<R>& lp)
{
   R pseudoObj = this->m_objoffset;

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      R val = lp.maxObj(j);

      if(val < 0)
      {
         if(lp.lower(j) <= R(-infinity))
            return;

         pseudoObj += val * lp.lower(j);
      }
      else if(val > 0)
      {
         if(lp.upper(j) >= R(-infinity))
            return;

         pseudoObj += val * lp.upper(j);
      }
   }

   if(GT(m_cutoffbound, R(-infinity), this->tolerances()->epsilon())
         && LT(m_cutoffbound, R(infinity), this->tolerances()->epsilon()))
   {
      if(pseudoObj > m_pseudoobj)
         m_pseudoobj = pseudoObj;

      for(int j = lp.nCols() - 1; j >= 0; --j)
      {
         R objval = lp.maxObj(j);

         if(EQ(objval, R(0.0), this->tolerances()->epsilon()))
            continue;

         if(objval < 0.0)
         {
            R newbound = lp.lower(j) + (m_cutoffbound - m_pseudoobj) / objval;

            if(LT(newbound, lp.upper(j), this->tolerances()->epsilon()))
            {
               std::shared_ptr<PostStep> ptr(new TightenBoundsPS(lp, j, lp.upper(j), lp.lower(j),
                                             this->_tolerances));
               m_hist.append(ptr);
               lp.changeUpper(j, newbound);
            }
         }
         else if(objval > 0.0)
         {
            R newbound = lp.upper(j) + (m_cutoffbound - m_pseudoobj) / objval;

            if(GT(newbound, lp.lower(j), this->tolerances()->epsilon()))
            {
               std::shared_ptr<PostStep> ptr(new TightenBoundsPS(lp, j, lp.upper(j), lp.lower(j),
                                             this->_tolerances));
               m_hist.append(ptr);
               lp.changeLower(j, newbound);
            }
         }
      }
   }
}